

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandDELE(FtpSession *this,string *param)

{
  FtpSession *this_00;
  bool bVar1;
  FileType FVar2;
  Permission PVar3;
  int iVar4;
  element_type *peVar5;
  char *__name;
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  undefined4 local_150;
  allocator local_149;
  string local_148 [32];
  undefined1 local_128 [8];
  FileStatus file_status;
  string local_path;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *param_local;
  FtpSession *this_local;
  
  local_18 = param;
  param_local = (string *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->logged_in_user_);
  if (bVar1) {
    this_00 = (FtpSession *)(file_status.file_status_.__glibc_reserved + 2);
    toLocalPath(this_00,(string *)this);
    Filesystem::FileStatus::FileStatus((FileStatus *)local_128,(string *)this_00);
    bVar1 = Filesystem::FileStatus::isOk((FileStatus *)local_128);
    if (bVar1) {
      FVar2 = Filesystem::FileStatus::type((FileStatus *)local_128);
      if (FVar2 == RegularFile) {
        peVar5 = ::std::
                 __shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->logged_in_user_);
        PVar3 = operator&(peVar5->permissions_,FileDelete);
        if (PVar3 == None) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_198,"Permission denied",&local_199);
          sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_198);
          ::std::__cxx11::string::~string(local_198);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
        }
        else {
          __name = (char *)::std::__cxx11::string::c_str();
          iVar4 = unlink(__name);
          if (iVar4 == 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_1c0,"Successfully deleted file",&local_1c1);
            sendFtpMessage(this,FILE_ACTION_COMPLETED,(string *)local_1c0);
            ::std::__cxx11::string::~string(local_1c0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_1e8,"Unable to delete file",&local_1e9);
            sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_1e8);
            ::std::__cxx11::string::~string(local_1e8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          }
        }
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_170,"Resource is not a file",&local_171);
        sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_170);
        ::std::__cxx11::string::~string(local_170);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_171);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_148,"Resource does not exist",&local_149);
      sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_148);
      ::std::__cxx11::string::~string(local_148);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
    local_150 = 1;
    Filesystem::FileStatus::~FileStatus((FileStatus *)local_128);
    ::std::__cxx11::string::~string((string *)(file_status.file_status_.__glibc_reserved + 2));
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Not logged in",&local_39);
    sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandDELE(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }
    std::string local_path = toLocalPath(param);

    auto file_status = Filesystem::FileStatus(local_path);

    if (!file_status.isOk())
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Resource does not exist");
      return;
    }
    else if (file_status.type() != Filesystem::FileType::RegularFile)
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Resource is not a file");
      return;
    }
    else
    {
      if (static_cast<int>(logged_in_user_->permissions_ & Permission::FileDelete) == 0)
      {
        sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
        return;
      }
      else
      {
#ifdef WIN32
        if (DeleteFileW(StrConvert::Utf8ToWide(local_path).c_str()) != 0)
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully deleted file");
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Unable to delete file: " + GetLastErrorStr());
          return;
        }
#else
        if (unlink(local_path.c_str()) == 0)
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully deleted file");
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Unable to delete file");
          return;
        }
#endif
      }
    }
  }